

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_backup_finish(sqlite3_backup *p)

{
  Pager *pPager;
  sqlite3_backup *in_RDI;
  int rc;
  Btree *unaff_retaddr;
  sqlite3 *pSrcDb;
  sqlite3_backup **pp;
  int local_28;
  sqlite3 *db;
  sqlite3_backup **local_18;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if (in_RDI == (sqlite3_backup *)0x0) {
    local_28 = 0;
  }
  else {
    db = in_RDI->pSrcDb;
    sqlite3_mutex_enter((sqlite3_mutex *)0x13d1f4);
    sqlite3BtreeEnter((Btree *)0x13d202);
    if (in_RDI->pDestDb != (sqlite3 *)0x0) {
      sqlite3_mutex_enter((sqlite3_mutex *)0x13d21e);
    }
    if (in_RDI->pDestDb != (sqlite3 *)0x0) {
      in_RDI->pSrc->nBackup = in_RDI->pSrc->nBackup + -1;
    }
    if (in_RDI->isAttached != 0) {
      pPager = sqlite3BtreePager(in_RDI->pSrc);
      for (local_18 = sqlite3PagerBackupPtr(pPager); *local_18 != in_RDI;
          local_18 = &(*local_18)->pNext) {
      }
      *local_18 = in_RDI->pNext;
    }
    sqlite3BtreeRollback(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8);
    if (in_RDI->rc == 0x65) {
      local_28 = 0;
    }
    else {
      local_28 = in_RDI->rc;
    }
    if (in_RDI->pDestDb != (sqlite3 *)0x0) {
      sqlite3Error(db,local_28);
      sqlite3LeaveMutexAndCloseZombie((sqlite3 *)pp);
    }
    sqlite3BtreeLeave((Btree *)0x13d301);
    if (in_RDI->pDestDb != (sqlite3 *)0x0) {
      sqlite3_free((void *)0x13d316);
    }
    sqlite3LeaveMutexAndCloseZombie((sqlite3 *)pp);
  }
  return local_28;
}

Assistant:

SQLITE_API int sqlite3_backup_finish(sqlite3_backup *p){
  sqlite3_backup **pp;                 /* Ptr to head of pagers backup list */
  sqlite3 *pSrcDb;                     /* Source database connection */
  int rc;                              /* Value to return */

  /* Enter the mutexes */
  if( p==0 ) return SQLITE_OK;
  pSrcDb = p->pSrcDb;
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  /* Detach this backup from the source pager. */
  if( p->pDestDb ){
    p->pSrc->nBackup--;
  }
  if( p->isAttached ){
    pp = sqlite3PagerBackupPtr(sqlite3BtreePager(p->pSrc));
    assert( pp!=0 );
    while( *pp!=p ){
      pp = &(*pp)->pNext;
      assert( pp!=0 );
    }
    *pp = p->pNext;
  }

  /* If a transaction is still open on the Btree, roll it back. */
  sqlite3BtreeRollback(p->pDest, SQLITE_OK, 0);

  /* Set the error code of the destination database handle. */
  rc = (p->rc==SQLITE_DONE) ? SQLITE_OK : p->rc;
  if( p->pDestDb ){
    sqlite3Error(p->pDestDb, rc);

    /* Exit the mutexes and free the backup context structure. */
    sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
  }
  sqlite3BtreeLeave(p->pSrc);
  if( p->pDestDb ){
    /* EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    sqlite3_free(p);
  }
  sqlite3LeaveMutexAndCloseZombie(pSrcDb);
  return rc;
}